

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int mbedtls_x509_crt_info(char *buf,size_t size,char *prefix,mbedtls_x509_crt *crt)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  bool bVar6;
  char local_68 [8];
  char key_size_str [18];
  char *local_40;
  char *p;
  size_t n;
  
  local_40 = buf;
  p = (char *)size;
  if (crt == (mbedtls_x509_crt *)0x0) {
    uVar1 = snprintf(buf,size,"\nCertificate is uninitialised!\n");
  }
  else {
    uVar1 = snprintf(buf,size,"%scert. version     : %d\n",prefix,(ulong)(uint)crt->version);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    pcVar3 = (char *)(ulong)uVar1;
    bVar6 = p < pcVar3;
    p = p + -(long)pcVar3;
    if (bVar6 || p == (char *)0x0) {
      return -0x2980;
    }
    local_40 = pcVar3 + (long)local_40;
    uVar1 = snprintf(local_40,(size_t)p,"%sserial number     : ",prefix);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    pcVar3 = (char *)(ulong)uVar1;
    bVar6 = p < pcVar3;
    p = p + -(long)pcVar3;
    if (bVar6 || p == (char *)0x0) {
      return -0x2980;
    }
    local_40 = pcVar3 + (long)local_40;
    uVar1 = mbedtls_x509_serial_gets(local_40,(size_t)p,&crt->serial);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    pcVar3 = (char *)(ulong)uVar1;
    bVar6 = p < pcVar3;
    p = p + -(long)pcVar3;
    if (bVar6 || p == (char *)0x0) {
      return -0x2980;
    }
    local_40 = pcVar3 + (long)local_40;
    uVar1 = snprintf(local_40,(size_t)p,"\n%sissuer name       : ",prefix);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    pcVar3 = (char *)(ulong)uVar1;
    bVar6 = p < pcVar3;
    p = p + -(long)pcVar3;
    if (bVar6 || p == (char *)0x0) {
      return -0x2980;
    }
    local_40 = pcVar3 + (long)local_40;
    uVar1 = mbedtls_x509_dn_gets(local_40,(size_t)p,&crt->issuer);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    pcVar3 = (char *)(ulong)uVar1;
    bVar6 = p < pcVar3;
    p = p + -(long)pcVar3;
    if (bVar6 || p == (char *)0x0) {
      return -0x2980;
    }
    local_40 = pcVar3 + (long)local_40;
    uVar1 = snprintf(local_40,(size_t)p,"\n%ssubject name      : ",prefix);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    pcVar3 = (char *)(ulong)uVar1;
    bVar6 = p < pcVar3;
    p = p + -(long)pcVar3;
    if (bVar6 || p == (char *)0x0) {
      return -0x2980;
    }
    local_40 = pcVar3 + (long)local_40;
    uVar1 = mbedtls_x509_dn_gets(local_40,(size_t)p,&crt->subject);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    pcVar3 = (char *)(ulong)uVar1;
    bVar6 = p < pcVar3;
    p = p + -(long)pcVar3;
    if (bVar6 || p == (char *)0x0) {
      return -0x2980;
    }
    local_40 = pcVar3 + (long)local_40;
    uVar1 = snprintf(local_40,(size_t)p,"\n%sissued  on        : %04d-%02d-%02d %02d:%02d:%02d",
                     prefix,(ulong)(uint)(crt->valid_from).year,(ulong)(uint)(crt->valid_from).mon,
                     (ulong)(uint)(crt->valid_from).day,(ulong)(uint)(crt->valid_from).hour,
                     (ulong)(uint)(crt->valid_from).min,(ulong)(uint)(crt->valid_from).sec);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    pcVar3 = (char *)(ulong)uVar1;
    bVar6 = p < pcVar3;
    p = p + -(long)pcVar3;
    if (bVar6 || p == (char *)0x0) {
      return -0x2980;
    }
    local_40 = pcVar3 + (long)local_40;
    uVar1 = snprintf(local_40,(size_t)p,"\n%sexpires on        : %04d-%02d-%02d %02d:%02d:%02d",
                     prefix,(ulong)(uint)(crt->valid_to).year,(ulong)(uint)(crt->valid_to).mon,
                     (ulong)(uint)(crt->valid_to).day,(ulong)(uint)(crt->valid_to).hour,
                     (ulong)(uint)(crt->valid_to).min,(ulong)(uint)(crt->valid_to).sec);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    pcVar3 = (char *)(ulong)uVar1;
    bVar6 = p < pcVar3;
    p = p + -(long)pcVar3;
    if (bVar6 || p == (char *)0x0) {
      return -0x2980;
    }
    local_40 = pcVar3 + (long)local_40;
    uVar1 = snprintf(local_40,(size_t)p,"\n%ssigned using      : ",prefix);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    pcVar3 = (char *)(ulong)uVar1;
    bVar6 = p < pcVar3;
    p = p + -(long)pcVar3;
    if (bVar6 || p == (char *)0x0) {
      return -0x2980;
    }
    local_40 = pcVar3 + (long)local_40;
    uVar1 = mbedtls_x509_sig_alg_gets
                      (local_40,(size_t)p,&crt->sig_oid,crt->sig_pk,crt->sig_md,crt->sig_opts);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    pcVar3 = (char *)(ulong)uVar1;
    bVar6 = p < pcVar3;
    p = p + -(long)pcVar3;
    if (bVar6 || p == (char *)0x0) {
      return -0x2980;
    }
    local_40 = local_40 + (long)pcVar3;
    pcVar3 = mbedtls_pk_get_name(&crt->pk);
    iVar2 = mbedtls_x509_key_size_helper(local_68,0x12,pcVar3);
    pcVar3 = local_40;
    if (iVar2 != 0) {
      return iVar2;
    }
    stack0xffffffffffffffb0 = p;
    sVar5 = mbedtls_pk_get_bitlen(&crt->pk);
    uVar1 = snprintf(pcVar3,(size_t)stack0xffffffffffffffb0,"\n%s%-18s: %d bits",prefix,local_68,
                     sVar5 & 0xffffffff);
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    pcVar3 = (char *)(ulong)uVar1;
    bVar6 = p < pcVar3;
    p = p + -(long)pcVar3;
    if (bVar6 || p == (char *)0x0) {
      return -0x2980;
    }
    local_40 = pcVar3 + (long)local_40;
    if ((crt->ext_types & 0x100) != 0) {
      pcVar3 = "true";
      if (crt->ca_istrue == 0) {
        pcVar3 = "false";
      }
      uVar1 = snprintf(local_40,(size_t)p,"\n%sbasic constraints : CA=%s",prefix,pcVar3);
      if ((int)uVar1 < 0) {
        return -0x2980;
      }
      pcVar3 = (char *)(ulong)uVar1;
      bVar6 = p < pcVar3;
      p = p + -(long)pcVar3;
      if (bVar6 || p == (char *)0x0) {
        return -0x2980;
      }
      local_40 = pcVar3 + (long)local_40;
      if (0 < crt->max_pathlen) {
        uVar1 = snprintf(local_40,(size_t)p,", max_pathlen=%d",(ulong)(crt->max_pathlen - 1));
        if ((int)uVar1 < 0) {
          return -0x2980;
        }
        pcVar3 = (char *)(ulong)uVar1;
        bVar6 = p < pcVar3;
        p = p + -(long)pcVar3;
        if (bVar6 || p == (char *)0x0) {
          return -0x2980;
        }
        local_40 = local_40 + (long)pcVar3;
      }
    }
    if ((crt->ext_types & 0x20) != 0) {
      uVar1 = snprintf(local_40,(size_t)p,"\n%ssubject alt name  :",prefix);
      if ((int)uVar1 < 0) {
        return -0x2980;
      }
      pcVar3 = (char *)(ulong)uVar1;
      bVar6 = p < pcVar3;
      p = p + -(long)pcVar3;
      if (bVar6 || p == (char *)0x0) {
        return -0x2980;
      }
      local_40 = local_40 + (long)pcVar3;
      iVar2 = mbedtls_x509_info_subject_alt_name
                        (&local_40,(size_t *)&p,&crt->subject_alt_names,prefix);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    if ((crt->ext_types & 0x10000) != 0) {
      uVar1 = snprintf(local_40,(size_t)p,"\n%scert. type        : ",prefix);
      if ((int)uVar1 < 0) {
        return -0x2980;
      }
      pcVar3 = (char *)(ulong)uVar1;
      bVar6 = p < pcVar3;
      p = p + -(long)pcVar3;
      if (bVar6 || p == (char *)0x0) {
        return -0x2980;
      }
      local_40 = local_40 + (long)pcVar3;
      iVar2 = mbedtls_x509_info_cert_type(&local_40,(size_t *)&p,crt->ns_cert_type);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    if ((crt->ext_types & 4) != 0) {
      uVar1 = snprintf(local_40,(size_t)p,"\n%skey usage         : ",prefix);
      if ((int)uVar1 < 0) {
        return -0x2980;
      }
      pcVar3 = (char *)(ulong)uVar1;
      bVar6 = p < pcVar3;
      p = p + -(long)pcVar3;
      if (bVar6 || p == (char *)0x0) {
        return -0x2980;
      }
      local_40 = local_40 + (long)pcVar3;
      iVar2 = mbedtls_x509_info_key_usage(&local_40,(size_t *)&p,crt->key_usage);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    if ((crt->ext_types & 0x800) != 0) {
      uVar1 = snprintf(local_40,(size_t)p,"\n%sext key usage     : ",prefix);
      if ((int)uVar1 < 0) {
        return -0x2980;
      }
      pcVar3 = (char *)(ulong)uVar1;
      bVar6 = p < pcVar3;
      p = p + -(long)pcVar3;
      if (bVar6 || p == (char *)0x0) {
        return -0x2980;
      }
      local_40 = local_40 + (long)pcVar3;
      iVar2 = x509_info_ext_key_usage(&local_40,(size_t *)&p,&crt->ext_key_usage);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    if ((crt->ext_types & 8) != 0) {
      uVar1 = snprintf(local_40,(size_t)p,"\n%scertificate policies : ",prefix);
      if ((int)uVar1 < 0) {
        return -0x2980;
      }
      pcVar3 = (char *)(ulong)uVar1;
      bVar6 = p < pcVar3;
      p = p + -(long)pcVar3;
      if (bVar6 || p == (char *)0x0) {
        return -0x2980;
      }
      local_40 = local_40 + (long)pcVar3;
      iVar2 = x509_info_cert_policies(&local_40,(size_t *)&p,&crt->certificate_policies);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    uVar1 = snprintf(local_40,(size_t)p,"\n");
  }
  iVar2 = -0x2980;
  if ((-1 < (int)uVar1) &&
     (lVar4 = (long)p - (long)(ulong)uVar1, (char *)(ulong)uVar1 <= p && lVar4 != 0)) {
    iVar2 = (int)size - (int)lVar4;
  }
  return iVar2;
}

Assistant:

int mbedtls_x509_crt_info(char *buf, size_t size, const char *prefix,
                          const mbedtls_x509_crt *crt)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n;
    char *p;
    char key_size_str[BEFORE_COLON];

    p = buf;
    n = size;

    if (NULL == crt) {
        ret = mbedtls_snprintf(p, n, "\nCertificate is uninitialised!\n");
        MBEDTLS_X509_SAFE_SNPRINTF;

        return (int) (size - n);
    }

    ret = mbedtls_snprintf(p, n, "%scert. version     : %d\n",
                           prefix, crt->version);
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_snprintf(p, n, "%sserial number     : ",
                           prefix);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_serial_gets(p, n, &crt->serial);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf(p, n, "\n%sissuer name       : ", prefix);
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets(p, n, &crt->issuer);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf(p, n, "\n%ssubject name      : ", prefix);
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets(p, n, &crt->subject);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf(p, n, "\n%sissued  on        : " \
                                 "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                           crt->valid_from.year, crt->valid_from.mon,
                           crt->valid_from.day,  crt->valid_from.hour,
                           crt->valid_from.min,  crt->valid_from.sec);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf(p, n, "\n%sexpires on        : " \
                                 "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                           crt->valid_to.year, crt->valid_to.mon,
                           crt->valid_to.day,  crt->valid_to.hour,
                           crt->valid_to.min,  crt->valid_to.sec);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf(p, n, "\n%ssigned using      : ", prefix);
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_sig_alg_gets(p, n, &crt->sig_oid, crt->sig_pk,
                                    crt->sig_md, crt->sig_opts);
    MBEDTLS_X509_SAFE_SNPRINTF;

    /* Key size */
    if ((ret = mbedtls_x509_key_size_helper(key_size_str, BEFORE_COLON,
                                            mbedtls_pk_get_name(&crt->pk))) != 0) {
        return ret;
    }

    ret = mbedtls_snprintf(p, n, "\n%s%-" BC "s: %d bits", prefix, key_size_str,
                           (int) mbedtls_pk_get_bitlen(&crt->pk));
    MBEDTLS_X509_SAFE_SNPRINTF;

    /*
     * Optional extensions
     */

    if (crt->ext_types & MBEDTLS_X509_EXT_BASIC_CONSTRAINTS) {
        ret = mbedtls_snprintf(p, n, "\n%sbasic constraints : CA=%s", prefix,
                               crt->ca_istrue ? "true" : "false");
        MBEDTLS_X509_SAFE_SNPRINTF;

        if (crt->max_pathlen > 0) {
            ret = mbedtls_snprintf(p, n, ", max_pathlen=%d", crt->max_pathlen - 1);
            MBEDTLS_X509_SAFE_SNPRINTF;
        }
    }

    if (crt->ext_types & MBEDTLS_X509_EXT_SUBJECT_ALT_NAME) {
        ret = mbedtls_snprintf(p, n, "\n%ssubject alt name  :", prefix);
        MBEDTLS_X509_SAFE_SNPRINTF;

        if ((ret = mbedtls_x509_info_subject_alt_name(&p, &n,
                                                      &crt->subject_alt_names,
                                                      prefix)) != 0) {
            return ret;
        }
    }

    if (crt->ext_types & MBEDTLS_X509_EXT_NS_CERT_TYPE) {
        ret = mbedtls_snprintf(p, n, "\n%scert. type        : ", prefix);
        MBEDTLS_X509_SAFE_SNPRINTF;

        if ((ret = mbedtls_x509_info_cert_type(&p, &n, crt->ns_cert_type)) != 0) {
            return ret;
        }
    }

    if (crt->ext_types & MBEDTLS_X509_EXT_KEY_USAGE) {
        ret = mbedtls_snprintf(p, n, "\n%skey usage         : ", prefix);
        MBEDTLS_X509_SAFE_SNPRINTF;

        if ((ret = mbedtls_x509_info_key_usage(&p, &n, crt->key_usage)) != 0) {
            return ret;
        }
    }

    if (crt->ext_types & MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE) {
        ret = mbedtls_snprintf(p, n, "\n%sext key usage     : ", prefix);
        MBEDTLS_X509_SAFE_SNPRINTF;

        if ((ret = x509_info_ext_key_usage(&p, &n,
                                           &crt->ext_key_usage)) != 0) {
            return ret;
        }
    }

    if (crt->ext_types & MBEDTLS_OID_X509_EXT_CERTIFICATE_POLICIES) {
        ret = mbedtls_snprintf(p, n, "\n%scertificate policies : ", prefix);
        MBEDTLS_X509_SAFE_SNPRINTF;

        if ((ret = x509_info_cert_policies(&p, &n,
                                           &crt->certificate_policies)) != 0) {
            return ret;
        }
    }

    ret = mbedtls_snprintf(p, n, "\n");
    MBEDTLS_X509_SAFE_SNPRINTF;

    return (int) (size - n);
}